

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void __thiscall
clickhouse::ColumnVector<unsigned_long>::ColumnVector(ColumnVector<unsigned_long> *this)

{
  Type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = (Type *)operator_new(0x10);
  Type::Type(this_00,UInt64);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<clickhouse::Type*>
            (&local_20,this_00);
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__Column_0016c598;
  (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this_00;
  (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_20._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_20._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00143114;
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
LAB_00143114:
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnVector_0016d5b8;
  (this->data_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ColumnVector<T>::ColumnVector()
    : Column(Type::CreateSimple<T>())
{
}